

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O1

wchar_t monster_critical(random_value dice,wchar_t rlev,wchar_t dam)

{
  wchar_t wVar1;
  wchar_t wVar2;
  uint32_t uVar3;
  uint uVar4;
  
  wVar1 = randcalc(dice,rlev,MAXIMISE);
  wVar2 = L'\0';
  if ((wVar1 * 0x13) / 0x14 <= dam) {
    if ((dam < L'\x14') && (wVar2 = Rand_div(100), dam <= wVar2)) {
      return L'\0';
    }
    uVar4 = (uint)(wVar1 == dam);
    if (L'\x13' < dam) {
      uVar4 = uVar4 - 1;
      do {
        uVar3 = Rand_div(100);
        uVar4 = uVar4 + 1;
      } while ((int)uVar3 < 2);
    }
    if (dam < L'.') {
      if (dam < L'\"') {
        if (dam < L'\x1a') {
          if (dam < L'\x13') {
            if (dam < L'\f') {
              wVar2 = uVar4 + L'\x01';
            }
            else {
              wVar2 = uVar4 + L'\x02';
            }
          }
          else {
            wVar2 = uVar4 + L'\x03';
          }
        }
        else {
          wVar2 = uVar4 + L'\x04';
        }
      }
      else {
        wVar2 = uVar4 + L'\x05';
      }
    }
    else {
      wVar2 = uVar4 + L'\x06';
    }
  }
  return wVar2;
}

Assistant:

static int monster_critical(random_value dice, int rlev, int dam)
{
	int max = 0;
	int total = randcalc(dice, rlev, MAXIMISE);

	/* Must do at least 95% of perfect */
	if (dam < total * 19 / 20) return (0);

	/* Weak blows rarely work */
	if ((dam < 20) && (randint0(100) >= dam)) return (0);

	/* Perfect damage */
	if (dam == total) max++;

	/* Super-charge */
	if (dam >= 20)
		while (randint0(100) < 2) max++;

	/* Critical damage */
	if (dam > 45) return (6 + max);
	if (dam > 33) return (5 + max);
	if (dam > 25) return (4 + max);
	if (dam > 18) return (3 + max);
	if (dam > 11) return (2 + max);
	return (1 + max);
}